

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::EmitCodeBlock
          (LuaBfbsGenerator *this,string *code_block,string *name,string *ns,string *declaring_file)

{
  bool bVar1;
  Object *pOVar2;
  String *pSVar3;
  ulong uVar4;
  pointer ppVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char *name_00;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_310 [8];
  string file_name;
  undefined1 local_2d8 [8];
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  _Self local_218;
  _Self local_210;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string full_qualified_name;
  undefined1 local_70 [8];
  string root_file;
  string root_type;
  string *declaring_file_local;
  string *ns_local;
  string *name_local;
  string *code_block_local;
  LuaBfbsGenerator *this_local;
  
  pOVar2 = reflection::Schema::root_table((this->super_BaseBfbsGenerator).schema_);
  pSVar3 = reflection::Object::name(pOVar2);
  String::str_abi_cxx11_((string *)((long)&root_file.field_2 + 8),pSVar3);
  pOVar2 = reflection::Schema::root_table((this->super_BaseBfbsGenerator).schema_);
  pSVar3 = reflection::Object::declaration_file(pOVar2);
  String::str_abi_cxx11_((string *)local_70,pSVar3);
  uVar4 = std::__cxx11::string::empty();
  code.field_2._M_local_buf[0xf] = '\0';
  if ((uVar4 & 1) == 0) {
    std::operator+(&local_c0,ns,".");
    code.field_2._M_local_buf[0xf] = '\x01';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_c0,name);
  }
  else {
    std::__cxx11::string::string((string *)local_a0,(string *)name);
  }
  if ((code.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::operator+(&local_108,"--[[ ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_108,"\n\n");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::operator+=
            ((string *)local_e8,
             "  Automatically generated by the FlatBuffers compiler, do not modify.\n");
  std::__cxx11::string::operator+=((string *)local_e8,"  Or modify. I\'m a message, not a cop.\n");
  std::__cxx11::string::operator+=((string *)local_e8,"\n");
  std::operator+(&local_148,"  flatc version: ",&this->flatc_version_);
  std::operator+(&local_128,&local_148,"\n");
  std::__cxx11::string::operator+=((string *)local_e8,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::operator+=((string *)local_e8,"\n");
  std::operator+(&local_188,"  Declared by  : ",declaring_file);
  std::operator+(&local_168,&local_188,"\n");
  std::__cxx11::string::operator+=((string *)local_e8,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 "  Rooting type : ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&root_file.field_2 + 8));
  std::operator+(&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                 ," (");
  std::operator+(&local_1c8,&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_1a8,&local_1c8,")\n");
  std::__cxx11::string::operator+=((string *)local_e8,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::operator+=((string *)local_e8,"\n--]]\n\n");
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->requires_);
  if (!bVar1) {
    local_210._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::cbegin(&this->requires_);
    while( true ) {
      local_218._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::cend(&this->requires_);
      bVar1 = std::operator!=(&local_210,&local_218);
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_210);
      std::operator+(&local_298,"local ",&ppVar5->first);
      std::operator+(&local_278,&local_298," = require(\'");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_210);
      std::operator+(&local_258,&local_278,&ppVar5->second);
      std::operator+(&local_238,&local_258,"\')\n");
      std::__cxx11::string::operator+=((string *)local_e8,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_210);
    }
    std::__cxx11::string::operator+=((string *)local_e8,"\n");
  }
  std::__cxx11::string::operator+=((string *)local_e8,(string *)code_block);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&path.field_2 + 8),"return ",name);
  std::__cxx11::string::operator+=((string *)local_e8,(string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_2d8,(string *)ns);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    file_name.field_2._M_local_buf[0xf] = '.';
    file_name.field_2._M_local_buf[0xe] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,file_name.field_2._M_local_buf + 0xf,
               file_name.field_2._M_local_buf + 0xe);
  }
  else {
    std::__cxx11::string::operator=((string *)local_2d8,".");
  }
  EnsureDirExists((string *)local_2d8);
  std::operator+(&local_350,&(this->options_).output_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  std::operator+(&local_330,&local_350,"/");
  Namer::File(&local_370,&(this->namer_).super_Namer,name,None);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 &local_330,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  name_00 = (char *)std::__cxx11::string::c_str();
  SaveFile(name_00,(string *)local_e8,false);
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(root_file.field_2._M_local_buf + 8));
  return;
}

Assistant:

void EmitCodeBlock(const std::string &code_block, const std::string &name,
                     const std::string &ns,
                     const std::string &declaring_file) const {
    const std::string root_type = schema_->root_table()->name()->str();
    const std::string root_file =
        schema_->root_table()->declaration_file()->str();
    const std::string full_qualified_name = ns.empty() ? name : ns + "." + name;

    std::string code = "--[[ " + full_qualified_name + "\n\n";
    code +=
        "  Automatically generated by the FlatBuffers compiler, do not "
        "modify.\n";
    code += "  Or modify. I'm a message, not a cop.\n";
    code += "\n";
    code += "  flatc version: " + flatc_version_ + "\n";
    code += "\n";
    code += "  Declared by  : " + declaring_file + "\n";
    code += "  Rooting type : " + root_type + " (" + root_file + ")\n";
    code += "\n--]]\n\n";

    if (!requires_.empty()) {
      for (auto it = requires_.cbegin(); it != requires_.cend(); ++it) {
        code += "local " + it->first + " = require('" + it->second + "')\n";
      }
      code += "\n";
    }

    code += code_block;
    code += "return " + name;

    // Namespaces are '.' deliminted, so replace it with the path separator.
    std::string path = ns;

    if (ns.empty()) {
      path = ".";
    } else {
      std::replace(path.begin(), path.end(), '.', '/');
    }

    // TODO(derekbailey): figure out a save file without depending on util.h
    EnsureDirExists(path);
    const std::string file_name =
        options_.output_path + path + "/" + namer_.File(name);
    SaveFile(file_name.c_str(), code, false);
  }